

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_relay.cpp
# Opt level: O2

void __thiscall UDPRelay::HandleEvent(UDPRelay *this,SOCKET s,int event)

{
  iterator iVar1;
  SOCKET local_3c;
  string local_38 [32];
  
  local_3c = s;
  if (this->server_socket_ == s) {
    if ((event & 8U) != 0) {
      Log::GetInstance();
      Log::FormatTime_abi_cxx11_();
      std::operator<<((ostream *)&std::cout,local_38);
      std::operator<<((ostream *)&std::cout," [info] ");
      std::operator<<((ostream *)&std::cout,"UDP server_socket err");
      std::__cxx11::string::~string(local_38);
    }
    HandleServer(this);
  }
  else if (s != -1) {
    iVar1 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (&(this->sockets_)._M_t,&local_3c);
    if ((_Rb_tree_header *)iVar1._M_node != &(this->sockets_)._M_t._M_impl.super__Rb_tree_header) {
      if ((event & 8U) != 0) {
        Log::GetInstance();
        Log::FormatTime_abi_cxx11_();
        std::operator<<((ostream *)&std::cout,local_38);
        std::operator<<((ostream *)&std::cout," [info] ");
        std::operator<<((ostream *)&std::cout,"UDP client_socket err");
        std::__cxx11::string::~string(local_38);
      }
      HandleClient(this,local_3c);
    }
  }
  return;
}

Assistant:

void UDPRelay::HandleEvent(SOCKET s, int event)
{
    if (s == server_socket_)
    {
        if (event & kPollErr)
        {
            LOGI << "UDP server_socket err";
        }
        HandleServer();
    }
    else if(s != INVALID_SOCKET &&
            sockets_.find(s) != sockets_.end())
    {
        if (event & kPollErr)
        {
            LOGI << "UDP client_socket err";
        }
        HandleClient(s);
    }
}